

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int yy_class_declare(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  code *action;
  char *name;
  int iVar9;
  int yythunkpos273;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,3,0,"yyPush");
  yyDo(G,yy_1_class_declare,G->begin,G->end,"yy_1_class_declare");
  iVar3 = yymatchString(G,"class");
  if (iVar3 == 0) goto LAB_00110c31;
  iVar3 = G->pos;
  iVar8 = G->thunkpos;
  iVar4 = yy_ws(G);
  if (iVar4 == 0) {
LAB_00110644:
    G->pos = iVar3;
    G->thunkpos = iVar8;
    iVar3 = 0;
  }
  else {
    do {
      iVar4 = G->pos;
      iVar9 = G->thunkpos;
      iVar5 = yy_ws(G);
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar9;
    iVar4 = yy_ident(G);
    if (iVar4 == 0) goto LAB_00110644;
    yyDo(G,yySet,-3,0,"yySet");
    iVar3 = 6;
  }
  if ((iVar3 != 6) && (iVar3 != 0)) {
    return 0;
  }
  do {
    iVar3 = G->pos;
    iVar8 = G->thunkpos;
    iVar4 = yy_ws(G);
  } while (iVar4 != 0);
  G->pos = iVar3;
  G->thunkpos = iVar8;
  yyDo(G,yyPush,2,0,"yyPush");
  iVar4 = G->pos;
  iVar9 = G->thunkpos;
  iVar5 = yymatchString(G,"is");
  if ((iVar5 == 0) || (iVar5 = yy_ws(G), iVar5 == 0)) {
LAB_001108fb:
    G->pos = iVar4;
    G->thunkpos = iVar9;
    iVar4 = yymatchString(G,"does");
    if ((iVar4 != 0) && (iVar4 = yy_ws(G), iVar4 != 0)) {
      do {
        iVar4 = G->pos;
        iVar9 = G->thunkpos;
        iVar5 = yy_ws(G);
      } while (iVar5 != 0);
      G->pos = iVar4;
      G->thunkpos = iVar9;
      iVar4 = yy_ident(G);
      if (iVar4 != 0) {
        yyDo(G,yySet,-2,0,"yySet");
        yyDo(G,yy_5_is_does_list,G->begin,G->end,"yy_5_is_does_list");
        do {
          iVar3 = G->pos;
          iVar8 = G->thunkpos;
          do {
            iVar4 = G->pos;
            iVar9 = G->thunkpos;
            iVar5 = yy_ws(G);
          } while (iVar5 != 0);
          G->pos = iVar4;
          G->thunkpos = iVar9;
          iVar4 = yymatchString(G,"is");
          if ((iVar4 == 0) || (iVar4 = yy_ws(G), iVar4 == 0)) {
LAB_00110a50:
            G->pos = iVar3;
            G->thunkpos = iVar8;
            do {
              iVar4 = G->pos;
              iVar9 = G->thunkpos;
              iVar5 = yy_ws(G);
            } while (iVar5 != 0);
            G->pos = iVar4;
            G->thunkpos = iVar9;
            iVar4 = yymatchString(G,"does");
            iVar9 = 0x16;
            if ((iVar4 != 0) && (iVar4 = yy_ws(G), iVar4 != 0)) {
              do {
                iVar4 = G->pos;
                iVar5 = G->thunkpos;
                iVar7 = yy_ws(G);
              } while (iVar7 != 0);
              G->pos = iVar4;
              G->thunkpos = iVar5;
              iVar4 = yy_ident(G);
              if (iVar4 != 0) {
                iVar9 = 0;
                yyDo(G,yySet,-1,0,"yySet");
                yyDo(G,yy_7_is_does_list,G->begin,G->end,"yy_7_is_does_list");
              }
            }
          }
          else {
            do {
              iVar4 = G->pos;
              iVar9 = G->thunkpos;
              iVar5 = yy_ws(G);
            } while (iVar5 != 0);
            G->pos = iVar4;
            G->thunkpos = iVar9;
            iVar4 = yy_ident(G);
            if (iVar4 == 0) goto LAB_00110a50;
            yyDo(G,yySet,-1,0,"yySet");
            yyDo(G,yy_6_is_does_list,G->begin,G->end,"yy_6_is_does_list");
            iVar9 = 0x15;
          }
          if (iVar9 == 0) {
LAB_00110b24:
            iVar9 = 0x11;
          }
          else if (iVar9 == 0x16) {
            G->pos = iVar3;
            G->thunkpos = iVar8;
            iVar9 = 0;
          }
          else if (iVar9 == 0x15) goto LAB_00110b24;
        } while (iVar9 != 0);
        iVar3 = G->begin;
        iVar8 = G->end;
        action = yy_8_is_does_list;
        name = "yy_8_is_does_list";
        goto LAB_00110b56;
      }
    }
    G->pos = iVar3;
    G->thunkpos = iVar8;
  }
  else {
    do {
      iVar5 = G->pos;
      iVar7 = G->thunkpos;
      iVar6 = yy_ws(G);
    } while (iVar6 != 0);
    G->pos = iVar5;
    G->thunkpos = iVar7;
    iVar5 = yy_ident(G);
    if (iVar5 == 0) goto LAB_001108fb;
    yyDo(G,yySet,-2,0,"yySet");
    yyDo(G,yy_1_is_does_list,G->begin,G->end,"yy_1_is_does_list");
    do {
      iVar3 = G->pos;
      iVar8 = G->thunkpos;
      do {
        iVar4 = G->pos;
        iVar9 = G->thunkpos;
        iVar5 = yy_ws(G);
      } while (iVar5 != 0);
      G->pos = iVar4;
      G->thunkpos = iVar9;
      iVar4 = yymatchString(G,"is");
      if ((iVar4 == 0) || (iVar4 = yy_ws(G), iVar4 == 0)) {
LAB_001107f0:
        G->pos = iVar3;
        G->thunkpos = iVar8;
        do {
          iVar4 = G->pos;
          iVar9 = G->thunkpos;
          iVar5 = yy_ws(G);
        } while (iVar5 != 0);
        G->pos = iVar4;
        G->thunkpos = iVar9;
        iVar4 = yymatchString(G,"does");
        iVar9 = 10;
        if ((iVar4 != 0) && (iVar4 = yy_ws(G), iVar4 != 0)) {
          do {
            iVar4 = G->pos;
            iVar5 = G->thunkpos;
            iVar7 = yy_ws(G);
          } while (iVar7 != 0);
          G->pos = iVar4;
          G->thunkpos = iVar5;
          iVar4 = yy_ident(G);
          if (iVar4 != 0) {
            iVar9 = 0;
            yyDo(G,yySet,-1,0,"yySet");
            yyDo(G,yy_3_is_does_list,G->begin,G->end,"yy_3_is_does_list");
          }
        }
      }
      else {
        do {
          iVar4 = G->pos;
          iVar9 = G->thunkpos;
          iVar5 = yy_ws(G);
        } while (iVar5 != 0);
        G->pos = iVar4;
        G->thunkpos = iVar9;
        iVar4 = yy_ident(G);
        if (iVar4 == 0) goto LAB_001107f0;
        yyDo(G,yySet,-1,0,"yySet");
        yyDo(G,yy_2_is_does_list,G->begin,G->end,"yy_2_is_does_list");
        iVar9 = 9;
      }
      if (iVar9 == 0) {
LAB_001108c4:
        iVar9 = 5;
      }
      else if (iVar9 == 10) {
        G->pos = iVar3;
        G->thunkpos = iVar8;
        iVar9 = 0;
      }
      else if (iVar9 == 9) goto LAB_001108c4;
    } while (iVar9 != 0);
    iVar3 = G->begin;
    iVar8 = G->end;
    action = yy_4_is_does_list;
    name = "yy_4_is_does_list";
LAB_00110b56:
    yyDo(G,action,iVar3,iVar8,name);
    yyDo(G,yyPop,2,0,"yyPop");
    yyDo(G,yySet,-2,0,"yySet");
  }
  do {
    iVar3 = G->pos;
    iVar8 = G->thunkpos;
    iVar4 = yy_ws(G);
  } while (iVar4 != 0);
  G->pos = iVar3;
  G->thunkpos = iVar8;
  iVar3 = yy_block(G);
  if (iVar3 != 0) {
    yyDo(G,yySet,-1,0,"yySet");
    yyDo(G,yy_2_class_declare,G->begin,G->end,"yy_2_class_declare");
    yyDo(G,yyPop,3,0,"yyPop");
    return 1;
  }
LAB_00110c31:
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_class_declare(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 3, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "class_declare"));
  yyDo(G, yy_1_class_declare, G->begin, G->end, "yy_1_class_declare");
  if (!yymatchString(G, "class")) goto l289;

  {  int yypos290= G->pos, yythunkpos290= G->thunkpos;  if (!yy_ws(G))  goto l290;

  l292:;	
  {  int yypos293= G->pos, yythunkpos293= G->thunkpos;  if (!yy_ws(G))  goto l293;
  goto l292;
  l293:;	  G->pos= yypos293; G->thunkpos= yythunkpos293;
  }  if (!yy_ident(G))  goto l290;
  yyDo(G, yySet, -3, 0, "yySet");
  goto l291;
  l290:;	  G->pos= yypos290; G->thunkpos= yythunkpos290;
  }
  l291:;	  if (!yy__(G))  goto l289;

  {  int yypos294= G->pos, yythunkpos294= G->thunkpos;  if (!yy_is_does_list(G))  goto l294;
  yyDo(G, yySet, -2, 0, "yySet");
  goto l295;
  l294:;	  G->pos= yypos294; G->thunkpos= yythunkpos294;
  }
  l295:;	  if (!yy__(G))  goto l289;
  if (!yy_block(G))  goto l289;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_class_declare, G->begin, G->end, "yy_2_class_declare");
  yyprintf((stderr, "  ok   class_declare"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 3, 0, "yyPop");
  return 1;
  l289:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "class_declare"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}